

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.h
# Opt level: O0

void __thiscall crnlib::dxt5_block::flip_x(dxt5_block *this,uint w,uint h)

{
  uint val;
  uint val_00;
  uint in_EDX;
  uint in_ESI;
  dxt5_block *in_RDI;
  uint c;
  uint y;
  uint x;
  undefined4 local_18;
  undefined4 local_14;
  
  for (local_14 = 0; local_14 < in_ESI >> 1; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
      val = get_selector(in_RDI,local_14,local_18);
      val_00 = get_selector(in_RDI,(in_ESI - 1) - local_14,local_18);
      set_selector(in_RDI,local_14,local_18,val_00);
      set_selector(in_RDI,(in_ESI - 1) - local_14,local_18,val);
    }
  }
  return;
}

Assistant:

inline void flip_x(uint w = 4, uint h = 4) {
    for (uint x = 0; x < (w / 2); x++) {
      for (uint y = 0; y < h; y++) {
        const uint c = get_selector(x, y);
        set_selector(x, y, get_selector((w - 1) - x, y));
        set_selector((w - 1) - x, y, c);
      }
    }
  }